

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

void ourWriteOut(CURL *curl,OutStruct *outs,char *writeinfo)

{
  char cVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  double doubleinfo;
  char local_49;
  long longinfo;
  char *stringp;
  OutStruct *local_38;
  
  __stream = _stdout;
  iVar2 = 0x25;
  local_38 = outs;
  do {
    while( true ) {
      if (writeinfo == (char *)0x0) {
        return;
      }
      cVar1 = *writeinfo;
      if (cVar1 == '%') break;
      if (cVar1 == '\\') {
        cVar1 = writeinfo[1];
        if (cVar1 == 't') {
          iVar4 = 9;
        }
        else {
          iVar4 = 0xd;
          if (cVar1 != 'r') {
            if (cVar1 != 'n') {
              iVar4 = 0x5c;
              goto LAB_0011244a;
            }
            iVar4 = 10;
          }
        }
LAB_00112456:
        fputc(iVar4,__stream);
        writeinfo = writeinfo + 2;
      }
      else {
        if (cVar1 == '\0') {
          return;
        }
        fputc((int)cVar1,__stream);
        writeinfo = writeinfo + 1;
      }
    }
    iVar4 = iVar2;
    if (writeinfo[1] != '{') {
      if (writeinfo[1] != '%') goto LAB_0011244a;
      goto LAB_00112456;
    }
    pcVar5 = strchr(writeinfo,0x7d);
    if (pcVar5 == (char *)0x0) {
LAB_0011244a:
      fputc(iVar4,__stream);
      iVar4 = (int)writeinfo[1];
      goto LAB_00112456;
    }
    local_49 = *pcVar5;
    *pcVar5 = '\0';
    lVar3 = 0;
    do {
      lVar6 = lVar3;
      if (lVar6 + 0x10 == 400) {
        curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",writeinfo + 2);
        goto switchD_0011242c_default;
      }
      iVar4 = curl_strequal(writeinfo + 2,*(undefined8 *)((long)&replacements[0].name + lVar6));
      lVar3 = lVar6 + 0x10;
    } while (iVar4 == 0);
    switch(*(undefined4 *)((long)&replacements[0].id + lVar6)) {
    case 1:
      uVar7 = 0x300003;
      break;
    case 2:
      uVar7 = 0x300004;
      break;
    case 3:
      uVar7 = 0x300005;
      break;
    case 4:
      uVar7 = 0x300021;
      break;
    case 5:
      uVar7 = 0x300006;
      break;
    case 6:
      uVar7 = 0x300011;
      break;
    case 7:
      uVar7 = 0x300008;
      goto LAB_0011258b;
    case 8:
      uVar7 = 0x300007;
LAB_0011258b:
      iVar4 = curl_easy_getinfo(curl,uVar7,&doubleinfo);
      if (iVar4 == 0) {
        pcVar8 = "%.0f";
        goto LAB_00112643;
      }
      goto switchD_0011242c_default;
    case 9:
      uVar7 = 0x300009;
      break;
    case 10:
      uVar7 = 0x30000a;
      break;
    case 0xb:
      uVar7 = 0x200002;
      goto LAB_001125f0;
    case 0xc:
      uVar7 = 0x200016;
LAB_001125f0:
      iVar4 = curl_easy_getinfo(curl,uVar7,&longinfo);
      if (iVar4 == 0) {
        pcVar9 = "%03ld";
        pcVar8 = (char *)longinfo;
        goto LAB_0011266a;
      }
      goto switchD_0011242c_default;
    case 0xd:
      uVar7 = 0x20000b;
      goto LAB_001125be;
    case 0xe:
      uVar7 = 0x20000c;
      goto LAB_001125be;
    case 0xf:
      uVar7 = 0x100001;
      goto LAB_00112680;
    case 0x10:
      uVar7 = 0x100012;
      goto LAB_00112680;
    case 0x11:
      uVar7 = 0x20001a;
      goto LAB_001125be;
    case 0x12:
      uVar7 = 0x300013;
      break;
    case 0x13:
      uVar7 = 0x200014;
      goto LAB_001125be;
    case 0x14:
      uVar7 = 0x10001e;
      goto LAB_00112680;
    case 0x15:
      uVar7 = 0x10001f;
LAB_00112680:
      iVar4 = curl_easy_getinfo(curl,uVar7,&stringp);
      if (stringp != (char *)0x0 && iVar4 == 0) {
        fputs(stringp,__stream);
      }
      goto switchD_0011242c_default;
    case 0x16:
      uVar7 = 0x20000d;
LAB_001125be:
      iVar4 = curl_easy_getinfo(curl,uVar7,&longinfo);
      if (iVar4 == 0) {
        pcVar9 = "%ld";
        pcVar8 = (char *)longinfo;
LAB_0011266a:
        curl_mfprintf(__stream,pcVar9,pcVar8);
      }
      goto switchD_0011242c_default;
    case 0x17:
      if (local_38->filename == (char *)0x0) goto switchD_0011242c_default;
      pcVar9 = "%s";
      pcVar8 = local_38->filename;
      goto LAB_0011266a;
    default:
      goto switchD_0011242c_default;
    }
    iVar4 = curl_easy_getinfo(curl,uVar7,&doubleinfo);
    if (iVar4 == 0) {
      pcVar8 = "%.3f";
LAB_00112643:
      curl_mfprintf(doubleinfo,__stream,pcVar8);
    }
switchD_0011242c_default:
    writeinfo = pcVar5 + 1;
    *pcVar5 = local_49;
  } while( true );
}

Assistant:

void ourWriteOut(CURL *curl, struct OutStruct *outs, const char *writeinfo)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  char *stringp;
  long longinfo;
  double doubleinfo;

  while(ptr && *ptr) {
    if('%' == *ptr) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        char keepit;
        int i;
        if(('{' == ptr[1]) && ((end = strchr(ptr, '}')) != NULL)) {
          bool match = FALSE;
          ptr += 2; /* pass the % and the { */
          keepit = *end;
          *end = 0; /* zero terminate */
          for(i = 0; replacements[i].name; i++) {
            if(curl_strequal(ptr, replacements[i].name)) {
              match = TRUE;
              switch(replacements[i].id) {
              case VAR_EFFECTIVE_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_HTTP_CODE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HTTP_CODE_PROXY:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_CONNECTCODE,
                                     &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HEADER_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REQUEST_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REQUEST_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_NUM_CONNECTS:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_COUNT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_TOTAL_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_NAMELOOKUP_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_APPCONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_APPCONNECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_PRETRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_STARTTRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SIZE_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SIZE_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SPEED_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SPEED_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONTENT_TYPE:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_CONTENT_TYPE, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_FTP_ENTRY_PATH:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_FTP_ENTRY_PATH, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_REDIRECT_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_EFFECTIVE_FILENAME:
                if(outs->filename)
                  fprintf(stream, "%s", outs->filename);
                break;
              default:
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }

}